

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Concatenate.cc
# Opt level: O0

void __thiscall Pl_Concatenate::~Pl_Concatenate(Pl_Concatenate *this)

{
  Pl_Concatenate *this_local;
  
  ~Pl_Concatenate(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Concatenate::~Pl_Concatenate() = default;